

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_temp(tcv_t *tcv,int16_t *temp)

{
  en_calibration_type eVar1;
  int local_28;
  en_calibration_type calib;
  int err;
  int16_t val;
  int16_t *temp_local;
  tcv_t *tcv_local;
  
  calib._2_2_ = DD_UNAVAILABLE >> 0x10;
  _err = temp;
  temp_local = (int16_t *)tcv;
  eVar1 = sfp_dd_type(tcv);
  if (eVar1 == DD_UNAVAILABLE) {
    local_28 = -6;
  }
  else if (eVar1 == DD_CALIB_INTERNAL) {
    local_28 = get_short_ad_val((tcv_t *)temp_local,'`',(int16_t *)((long)&calib + 2));
  }
  else if (eVar1 == DD_CALIB_EXTERNAL) {
    local_28 = get_temp_calib_f8((tcv_t *)temp_local,(int16_t *)((long)&calib + 2));
  }
  else {
    local_28 = -1;
  }
  if (local_28 < 0) {
    tcv_local._4_4_ = local_28;
  }
  else {
    *_err = calib._2_2_;
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

static int sfp_get_temp(tcv_t *tcv, int16_t* temp)
{
	int16_t val=0;
	int err = 0;

	en_calibration_type calib;

	calib = sfp_dd_type(tcv);

	switch (calib) {
		case DD_UNAVAILABLE:
			err = TCV_ERR_DIAGNOSTICS_INFO_NOT_PRESENT;
			break;
		case DD_CALIB_INTERNAL:
			err = get_short_ad_val(tcv, DD_TEMP_AD_REG, &val);
			break;
		case DD_CALIB_EXTERNAL:
			err = get_temp_calib_f8(tcv, &val);
			break;
		default:
			err = TCV_ERR_GENERIC;
	}
	if (err < 0)
		return err;

	*temp = (int16_t) val;
	return 0;
}